

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_comm_create_group_
               (MPIABI_Fint *comm,MPIABI_Fint *group,MPIABI_Fint *tag,MPIABI_Fint *newcomm,
               MPIABI_Fint *ierror)

{
  mpi_comm_create_group_();
  return;
}

Assistant:

void mpiabi_comm_create_group_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * group,
  const MPIABI_Fint * tag,
  MPIABI_Fint * newcomm,
  MPIABI_Fint * ierror
) {
  return mpi_comm_create_group_(
    comm,
    group,
    tag,
    newcomm,
    ierror
  );
}